

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.h
# Opt level: O1

bool FIX::trailer_order::compare(int x,int y)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  
  if (x == 10) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (y != 10) {
      if (((x - 0x59U | y - 0x59U) & 0xfffffffb) == 0) {
        bVar2 = (y == 0x59) * '\x02';
        if (y == 0x5d) {
          bVar2 = 1;
        }
        bVar3 = (x == 0x59) * '\x02';
        if (x == 0x5d) {
          bVar3 = 1;
        }
        return bVar3 < bVar2;
      }
      if ((x | 4U) != 0x5d) {
        return (y - 0x59U & 0xfffffffb) != 0 && x < y;
      }
    }
  }
  return bVar1;
}

Assistant:

static bool compare(const int x, const int y) {
    if (x == FIELD::CheckSum) {
      return false;
    } else if (y == FIELD::CheckSum) {
      return true;
    }

    int orderedX = getOrderedPosition(x);
    int orderedY = getOrderedPosition(y);

    if (orderedX && orderedY) {
      return orderedX < orderedY;
    } else if (orderedX) {
      return true;
    } else if (orderedY) {
      return false;
    } else {
      return x < y;
    }
  }